

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  int *piVar1;
  DAM *this_00;
  char *in_RDX;
  string *in_stack_00000068;
  string *in_stack_00000070;
  string *in_stack_00000078;
  HRRDoubletStepList *in_stack_00000080;
  ostream *in_stack_00000088;
  OSTEI_HRR_Writer *in_stack_00000090;
  HRRDoubletStepList brasteps;
  string ket_str;
  string ncart_ket_str;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  QAM *in_stack_fffffffffffffeb0;
  allocator *itag;
  int in_stack_fffffffffffffeb8;
  int iVar2;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar3;
  char *arg;
  allocator local_d1;
  string local_d0 [32];
  DAM *in_stack_ffffffffffffff50;
  OSTEI_HRR_Algorithm_Base *in_stack_ffffffffffffff58;
  string local_60 [36];
  int local_3c;
  string local_38 [56];
  
  uVar3 = 2;
  piVar1 = QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  iVar2 = *piVar1;
  piVar1 = QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_3c = NCART(iVar2,*piVar1);
  StringBuilder<int>((int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  arg = amchar;
  QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  StringBuilder<char,char_const(&)[2],char_const&>
            (arg,(char (*) [2])CONCAT44(uVar3,in_stack_ffffffffffffff10),in_RDX);
  piVar1 = QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  iVar2 = *piVar1;
  this_00 = (DAM *)QAM::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  itag = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",itag);
  DAM::DAM(this_00,iVar2,in_stack_fffffffffffffeb8,(string *)itag);
  OSTEI_HRR_Algorithm_Base::GetBraSteps(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  DAM::~DAM((DAM *)0x14cffd);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  WriteBraSteps_(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070,in_stack_00000068);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector
            ((vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *)this_00);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Bra_Inline_(std::ostream & os, QAM am) const
{
    // ncart_ket in string form
    std::string ncart_ket_str = StringBuilder(NCART(am[2], am[3]));

    // the ket part in string form
    std::string ket_str = StringBuilder(amchar[am[2]], "_", amchar[am[3]]);

    // actually write out the steps now
    auto brasteps = hrr_algo_.GetBraSteps(DAM{am[0], am[1]});
    WriteBraSteps_(os, brasteps, am.tag, ncart_ket_str, ket_str);
}